

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O3

int Cnf_ManScanMapping_rec(Cnf_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vMapped,int fPreorder)

{
  ulong uVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  
  uVar1 = *(ulong *)&pObj->field_0x18;
  uVar4 = uVar1 & 0xffffffff0000003f | (ulong)((uint)uVar1 + 0x40 & 0xffffffc0);
  *(ulong *)&pObj->field_0x18 = uVar4;
  iVar8 = 0;
  if (((uVar1 & 0xffffffc0) == 0) && (uVar7 = (uint)uVar1 & 7, iVar8 = 0, uVar7 != 2)) {
    if (((ulong)pObj & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                    ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
    }
    if (uVar7 != 1) {
      if (uVar7 != 5) {
        __assert_fail("Aig_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfUtil.c"
                      ,0x7f,"int Cnf_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, int)"
                     );
      }
      if ((pObj->field_5).pData == (void *)0x0) {
        __assert_fail("pObj->pData != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfUtil.c"
                      ,0x80,"int Cnf_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, int)"
                     );
      }
      if (fPreorder != 0 && vMapped != (Vec_Ptr_t *)0x0) {
        uVar7 = vMapped->nSize;
        if (uVar7 == vMapped->nCap) {
          if ((int)uVar7 < 0x10) {
            if (vMapped->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vMapped->pArray,0x80);
            }
            vMapped->pArray = ppvVar5;
            vMapped->nCap = 0x10;
          }
          else {
            if (vMapped->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vMapped->pArray,(ulong)uVar7 << 4);
            }
            vMapped->pArray = ppvVar5;
            vMapped->nCap = uVar7 * 2;
          }
        }
        else {
          ppvVar5 = vMapped->pArray;
        }
        iVar8 = vMapped->nSize;
        vMapped->nSize = iVar8 + 1;
        ppvVar5[iVar8] = pObj;
        uVar4 = *(ulong *)&pObj->field_0x18;
      }
      if ((uVar4 & 0x20) == 0) {
        pcVar2 = (char *)(pObj->field_5).pData;
        iVar8 = (int)pcVar2[1];
        if (iVar8 == 0x7f) {
          __assert_fail("pCutBest->Cost < 127",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfUtil.c"
                        ,0x94,
                        "int Cnf_ManScanMapping_rec(Cnf_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, int)");
        }
        if ('\0' < *pcVar2) {
          lVar9 = 0;
          do {
            pVVar6 = p->pManAig->vObjs;
            if (pVVar6 == (Vec_Ptr_t *)0x0) break;
            uVar7 = *(uint *)(pcVar2 + lVar9 * 4 + 0x18);
            if (((int)uVar7 < 0) || (pVVar6->nSize <= (int)uVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            if ((Aig_Obj_t *)pVVar6->pArray[uVar7] == (Aig_Obj_t *)0x0) break;
            iVar3 = Cnf_ManScanMapping_rec(p,(Aig_Obj_t *)pVVar6->pArray[uVar7],vMapped,fPreorder);
            iVar8 = iVar8 + iVar3;
            lVar9 = lVar9 + 1;
          } while (lVar9 < *pcVar2);
        }
      }
      else {
        pVVar6 = (Vec_Ptr_t *)malloc(0x10);
        pVVar6->nCap = 100;
        pVVar6->nSize = 0;
        ppvVar5 = (void **)malloc(800);
        pVVar6->pArray = ppvVar5;
        Aig_ObjCollectSuper(pObj,pVVar6);
        iVar8 = pVVar6->nSize + 1;
        if (0 < pVVar6->nSize) {
          lVar9 = 0;
          do {
            iVar3 = Cnf_ManScanMapping_rec
                              (p,(Aig_Obj_t *)((ulong)pVVar6->pArray[lVar9] & 0xfffffffffffffffe),
                               vMapped,fPreorder);
            iVar8 = iVar8 + iVar3;
            lVar9 = lVar9 + 1;
          } while (lVar9 < pVVar6->nSize);
        }
        if (pVVar6->pArray != (void **)0x0) {
          free(pVVar6->pArray);
        }
        free(pVVar6);
        pObj->field_0x18 = pObj->field_0x18 | 0x20;
      }
      if (vMapped != (Vec_Ptr_t *)0x0 && fPreorder == 0) {
        uVar7 = vMapped->nSize;
        if (uVar7 == vMapped->nCap) {
          if ((int)uVar7 < 0x10) {
            if (vMapped->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vMapped->pArray,0x80);
            }
            vMapped->pArray = ppvVar5;
            vMapped->nCap = 0x10;
          }
          else {
            if (vMapped->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vMapped->pArray,(ulong)uVar7 << 4);
            }
            vMapped->pArray = ppvVar5;
            vMapped->nCap = uVar7 * 2;
          }
        }
        else {
          ppvVar5 = vMapped->pArray;
        }
        iVar3 = vMapped->nSize;
        vMapped->nSize = iVar3 + 1;
        ppvVar5[iVar3] = pObj;
      }
    }
  }
  return iVar8;
}

Assistant:

int Cnf_ManScanMapping_rec( Cnf_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vMapped, int fPreorder )
{
    Aig_Obj_t * pLeaf;
    Cnf_Cut_t * pCutBest;
    int aArea, i;
    if ( pObj->nRefs++ || Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return 0;
    assert( Aig_ObjIsAnd(pObj) );
    assert( pObj->pData != NULL );
    // add the node to the mapping
    if ( vMapped && fPreorder )
         Vec_PtrPush( vMapped, pObj );
    // visit the transitive fanin of the selected cut
    if ( pObj->fMarkB )
    {
        Vec_Ptr_t * vSuper = Vec_PtrAlloc( 100 );
        Aig_ObjCollectSuper( pObj, vSuper );
        aArea = Vec_PtrSize(vSuper) + 1;
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
            aArea += Cnf_ManScanMapping_rec( p, Aig_Regular(pLeaf), vMapped, fPreorder );
        Vec_PtrFree( vSuper );
        ////////////////////////////
        pObj->fMarkB = 1;
    }
    else
    {
        pCutBest = (Cnf_Cut_t *)pObj->pData;
//        assert( pCutBest->nFanins > 0 );
        assert( pCutBest->Cost < 127 );
        aArea = pCutBest->Cost;
        Cnf_CutForEachLeaf( p->pManAig, pCutBest, pLeaf, i )
            aArea += Cnf_ManScanMapping_rec( p, pLeaf, vMapped, fPreorder );
    }
    // add the node to the mapping
    if ( vMapped && !fPreorder )
         Vec_PtrPush( vMapped, pObj );
    return aArea;
}